

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bindings.cpp
# Opt level: O0

void __thiscall
service::service(service *this,shared_ptr<interface1> *sp,bool b,int i,function<int_()> *f,int ni)

{
  int iVar1;
  element_type *peVar2;
  long local_60;
  int ni_local;
  function<int_()> *f_local;
  int i_local;
  bool b_local;
  shared_ptr<interface1> *sp_local;
  service *this_local;
  
  std::shared_ptr<interface1>::shared_ptr(&this->sp,sp);
  peVar2 = std::__shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>::get
                     (&sp->super___shared_ptr<interface1,_(__gnu_cxx::_Lock_policy)2>);
  if (peVar2 == (element_type *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(peVar2,&interface1::typeinfo,&implementation1_2::typeinfo,0);
  }
  if (local_60 == 0) {
    __assert_fail("dynamic_cast<implementation1_2*>(sp.get())",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                  ,0x23,
                  "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                 );
  }
  if (((b ^ 0xffU) & 1) == 0) {
    __assert_fail("!b",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                  ,0x24,
                  "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                 );
  }
  if (i == 0x2a) {
    iVar1 = std::function<int_()>::operator()(f);
    if (iVar1 != 0x57) {
      __assert_fail("f() == 87",
                    "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                    ,0x26,
                    "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                   );
    }
    if (ni == 0x7b) {
      return;
    }
    __assert_fail("ni == 123",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                  ,0x27,
                  "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
                 );
  }
  __assert_fail("i == 42",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/bindings.cpp"
                ,0x25,
                "service::service(const std::shared_ptr<interface1> &, bool, int, std::function<int ()>, const int)"
               );
}

Assistant:

int ni)
      : sp(sp) {
    assert(dynamic_cast<implementation1_2*>(sp.get()));  // overridden
    assert(!b);                                          // default initialization
    assert(i == 42);
    assert(f() == 87);
    assert(ni == 123);
  }